

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

int32_t __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_short,_16>,_charls::encoder_strategy>::
do_run_mode(jls_codec<charls::lossless_traits<unsigned_short,_16>,_charls::encoder_strategy> *this,
           int32_t index,encoder_strategy *param_2)

{
  ushort uVar1;
  pixel_type *ppVar2;
  pixel_type *ppVar3;
  bool bVar4;
  sample_type sVar5;
  int iVar6;
  int local_48;
  int32_t run_length;
  pixel_type ra;
  pixel_type *type_prev_x;
  pixel_type *type_cur_x;
  int32_t count_type_remain;
  encoder_strategy *param_2_local;
  int32_t index_local;
  jls_codec<charls::lossless_traits<unsigned_short,_16>,_charls::encoder_strategy> *this_local;
  
  iVar6 = this->width_ - index;
  ppVar2 = this->current_line_;
  ppVar3 = this->previous_line_;
  uVar1 = ppVar2[(long)index + -1];
  local_48 = 0;
  do {
    bVar4 = lossless_traits_impl<unsigned_short,_16>::is_near
                      ((uint)ppVar2[(long)index + (long)local_48],(uint)uVar1);
    if (!bVar4) break;
    ppVar2[(long)index + (long)local_48] = uVar1;
    local_48 = local_48 + 1;
  } while (local_48 != iVar6);
  encode_run_pixels(this,local_48,local_48 == iVar6);
  if (local_48 == iVar6) {
    this_local._4_4_ = local_48;
  }
  else {
    sVar5 = encode_run_interruption_pixel
                      (this,(uint)ppVar2[(long)index + (long)local_48],(uint)uVar1,
                       (uint)ppVar3[(long)index + (long)local_48]);
    ppVar2[(long)index + (long)local_48] = sVar5;
    decrement_run_index(this);
    this_local._4_4_ = local_48 + 1;
  }
  return this_local._4_4_;
}

Assistant:

int32_t do_run_mode(const int32_t index, encoder_strategy* /*strategy*/)
    {
        const int32_t count_type_remain = width_ - index;
        pixel_type* type_cur_x{current_line_ + index};
        const pixel_type* type_prev_x{previous_line_ + index};

        const pixel_type ra{type_cur_x[-1]};

        int32_t run_length{};
        while (traits_.is_near(type_cur_x[run_length], ra))
        {
            type_cur_x[run_length] = ra;
            ++run_length;

            if (run_length == count_type_remain)
                break;
        }

        encode_run_pixels(run_length, run_length == count_type_remain);

        if (run_length == count_type_remain)
            return run_length;

        type_cur_x[run_length] = encode_run_interruption_pixel(type_cur_x[run_length], ra, type_prev_x[run_length]);
        decrement_run_index();
        return run_length + 1;
    }